

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O0

void ncnn::softmax(float *_ptr,int size)

{
  float *pfVar1;
  int in_ESI;
  float *in_RDI;
  float fVar2;
  int i_2;
  float *ptr_2;
  int i_1;
  float *ptr_1;
  float sum;
  int i;
  float *ptr;
  float max;
  int local_3c;
  float *local_38;
  int local_2c;
  float *local_28;
  float local_20;
  int local_1c;
  float *local_18;
  float local_10;
  int local_c;
  float *local_8;
  
  local_10 = -3.4028235e+38;
  local_18 = in_RDI;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_1c = 0; local_1c < local_c; local_1c = local_1c + 1) {
    pfVar1 = std::max<float>(&local_10,local_18);
    local_10 = *pfVar1;
    local_18 = local_18 + 1;
  }
  local_20 = 0.0;
  local_28 = local_8;
  for (local_2c = 0; local_2c < local_c; local_2c = local_2c + 1) {
    fVar2 = expf(*local_28 - local_10);
    *local_28 = fVar2;
    local_20 = *local_28 + local_20;
    local_28 = local_28 + 1;
  }
  local_38 = local_8;
  for (local_3c = 0; local_3c < local_c; local_3c = local_3c + 1) {
    *local_38 = *local_38 / local_20;
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

static void softmax(float* _ptr, int size)
{
    // reduce max
    float max = -FLT_MAX;
    {
        const float* ptr = _ptr;
        for (int i = 0; i < size; i++)
        {
            max = std::max(max, *ptr++);
        }
    }

    // reduce exp(x - max)
    float sum = 0.f;
    {
        float* ptr = _ptr;
        for (int i = 0; i < size; i++)
        {
            *ptr = expf(*ptr - max);
            sum += *ptr;
            ptr++;
        }
    }

    // div sum
    {
        float* ptr = _ptr;
        for (int i = 0; i < size; i++)
        {
            *ptr++ /= sum;
        }
    }
}